

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O1

void disablegc1(int noerror)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  DLword *pDVar4;
  DLword *pDVar5;
  DLword *pDVar6;
  int iVar7;
  
  uVar3 = *INTERRUPTSTATE_word;
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
  }
  pDVar4 = Lisp_world;
  iVar7 = 0;
  do {
    pDVar5 = MDStypetbl;
    if (((ulong)MDStypetbl & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",MDStypetbl);
    }
    pDVar6 = MDStypetbl;
    uVar2 = *(ushort *)
             ((ulong)(Lisp_world +
                     (uint)((int)((ulong)((long)pDVar5 - (long)Lisp_world) >> 1) + iVar7)) ^ 2);
    if (((ulong)MDStypetbl & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",MDStypetbl);
    }
    *(ushort *)
     ((ulong)(Lisp_world + (uint)((int)((ulong)((long)pDVar6 - (long)Lisp_world) >> 1) + iVar7)) ^ 2
     ) = uVar2 | 0x8000;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x8000);
  *Reclaim_cnt_word = 0;
  *ReclaimMin_word = 0;
  if ((noerror == 0) && (*GcDisabled_word == 0)) {
    pbVar1 = (byte *)((long)pDVar4 + (ulong)uVar3 * 2 + 3);
    *pbVar1 = *pbVar1 | 0x10;
    *PENDINGINTERRUPT_word = 0x4c;
  }
  *GcDisabled_word = 0x4c;
  return;
}

Assistant:

void disablegc1(int noerror) {
  struct interruptstate *gcinterruptstate;
  int count, i;
  DLword typeword;
  gcinterruptstate = (struct interruptstate *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
  count = (128) * 256; /* This is test value. 128 is *MdsTTsize(\MDSTTsize) */
  for (i = 0; i < count; i++) {
    typeword = GETWORD((DLword *)NativeAligned2FromLAddr(LAddrFromNative(MDStypetbl) + i));
    GETWORD((DLword *)NativeAligned2FromLAddr(LAddrFromNative(MDStypetbl) + i)) = (typeword | TT_NOREF);
  }
  *Reclaim_cnt_word = NIL;
  *ReclaimMin_word = NIL;
  if ((noerror == NIL) && (*GcDisabled_word == NIL)) {
    gcinterruptstate->gcdisabled = T;
    *PENDINGINTERRUPT_word = ATOM_T;
  }
  *GcDisabled_word = ATOM_T;
}